

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::GetLinkerLanguage(string *__return_storage_ptr__,cmTarget *this,string *config)

{
  pointer pcVar1;
  LinkClosure *pLVar2;
  
  pLVar2 = GetLinkClosure(this,config);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pLVar2->LinkerLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (pLVar2->LinkerLanguage)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetLinkerLanguage(const std::string& config) const
{
  return this->GetLinkClosure(config)->LinkerLanguage;
}